

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countdown_latch_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::CountdownLatchTest_TestCountdownLatchThreadLock_Test::TestBody
          (CountdownLatchTest_TestCountdownLatchThreadLock_Test *this)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  char *in_R9;
  duration<long,_std::ratio<1L,_1L>_> local_78;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_40;
  thread thread;
  shared_ptr<bidfx_public_api::tools::CountdownLatch> latch;
  
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  std::make_unique<bidfx_public_api::tools::CountdownLatch,int>((int *)&gtest_ar);
  std::__shared_ptr<bidfx_public_api::tools::CountdownLatch,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<bidfx_public_api::tools::CountdownLatch,std::default_delete<bidfx_public_api::tools::CountdownLatch>,void>
            ((__shared_ptr<bidfx_public_api::tools::CountdownLatch,(__gnu_cxx::_Lock_policy)2> *)
             &latch,(unique_ptr<bidfx_public_api::tools::CountdownLatch,_std::default_delete<bidfx_public_api::tools::CountdownLatch>_>
                     *)&gtest_ar);
  std::
  unique_ptr<bidfx_public_api::tools::CountdownLatch,_std::default_delete<bidfx_public_api::tools::CountdownLatch>_>
  ::~unique_ptr((unique_ptr<bidfx_public_api::tools::CountdownLatch,_std::default_delete<bidfx_public_api::tools::CountdownLatch>_>
                 *)&gtest_ar);
  lVar2 = std::chrono::_V2::system_clock::now();
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0;
  gtest_ar_._0_4_ = 2;
  std::thread::
  thread<void(&)(std::shared_ptr<bidfx_public_api::tools::CountdownLatch>,std::chrono::duration<long,std::ratio<1l,1000l>>,int),std::shared_ptr<bidfx_public_api::tools::CountdownLatch>&,std::chrono::duration<long,std::ratio<1l,1l>>,int,void>
            (&thread,SleepThenCountdownLatch,&latch,(duration<long,_std::ratio<1L,_1L>_> *)&gtest_ar
             ,(int *)&gtest_ar_);
  bVar1 = (bool)bidfx_public_api::tools::CountdownLatch::Await
                          (latch.
                           super___shared_ptr<bidfx_public_api::tools::CountdownLatch,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,30000);
  lVar3 = std::chrono::_V2::system_clock::now();
  gtest_ar_.success_ = bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1 == false) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"result","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
               ,0x3e,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  local_78.__r._0_4_ = bidfx_public_api::tools::CountdownLatch::GetCount();
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"0","latch->GetCount()",(int *)&gtest_ar_,(uint *)&local_78);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
               ,0x3f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_._0_8_ = lVar3 - lVar2;
  local_78.__r = 0x1e;
  testing::internal::
  CmpHelperLT<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1l>>>
            ((internal *)&gtest_ar,"end.time_since_epoch() - start.time_since_epoch()",
             "std::chrono::seconds(30)",(duration<long,_std::ratio<1L,_1000000000L>_> *)&gtest_ar_,
             &local_78);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
               ,0x40,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::thread::join();
  std::thread::~thread(&thread);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&latch.
              super___shared_ptr<bidfx_public_api::tools::CountdownLatch,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

TEST(CountdownLatchTest, TestCountdownLatchThreadLock)
{
    std::shared_ptr<CountdownLatch> latch = std::make_unique<CountdownLatch>(2);
    std::chrono::time_point<std::chrono::system_clock> start = std::chrono::system_clock::now();
    std::thread thread(SleepThenCountdownLatch, latch, std::chrono::seconds(1), 2);
    bool result = latch->Await(std::chrono::seconds(30));
    std::chrono::time_point<std::chrono::system_clock> end = std::chrono::system_clock::now();
    EXPECT_TRUE(result);
    EXPECT_EQ(0, latch->GetCount());
    EXPECT_LT(end.time_since_epoch() - start.time_since_epoch(),std::chrono::seconds(30));
    thread.join();
}